

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

GLenum toGlCullMode(CullMode c)

{
  CullMode c_local;
  undefined4 local_4;
  
  if (c == Front) {
    local_4 = 0x404;
  }
  else if (c == Back) {
    local_4 = 0x405;
  }
  return local_4;
}

Assistant:

static inline GLenum toGlCullMode(QRhiGraphicsPipeline::CullMode c)
{
    switch (c) {
    case QRhiGraphicsPipeline::Front:
        return GL_FRONT;
    case QRhiGraphicsPipeline::Back:
        return GL_BACK;
    default:
        Q_UNREACHABLE_RETURN(GL_BACK);
    }
}